

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

int google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_CopyTo_Test::AddToRegistry
              (void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest>
  *this_01;
  TestMetaFactoryBase<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  *meta_factory;
  allocator<char> local_c3;
  allocator<char> local_c2;
  allocator<char> local_c1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  char local_b0 [8];
  undefined8 uStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  char local_90 [8];
  undefined8 uStack_88;
  CodeLocation local_80;
  CodeLocation local_58;
  string local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"AllowUnknownDependenciesTest",&local_c1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,&local_c2);
  local_58.file._M_string_length = local_98;
  local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
  if (local_a0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90) {
    local_58.file.field_2._8_8_ = uStack_88;
  }
  else {
    local_58.file._M_dataplus._M_p = (pointer)local_a0;
  }
  local_98 = 0;
  local_90[0] = '\0';
  local_58.line = 0xe50;
  local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_90;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest>
                      (this_00,&local_30,&local_58);
  meta_factory = (TestMetaFactoryBase<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
                  *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_01600780;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,&local_c3);
  local_80.file._M_string_length = local_b8;
  local_80.file._M_dataplus._M_p = (pointer)&local_80.file.field_2;
  if (local_c0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0) {
    local_80.file.field_2._8_8_ = uStack_a8;
  }
  else {
    local_80.file._M_dataplus._M_p = (pointer)local_c0;
  }
  local_b8 = 0;
  local_b0[0] = '\0';
  local_80.line = 0xe50;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_b0;
  testing::internal::
  ParameterizedTestSuiteInfo<google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest>::
  AddTestPattern(this_01,"AllowUnknownDependenciesTest","CopyTo",meta_factory,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_30);
  return 0;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, CopyTo) {
  // FieldDescriptor::CopyTo() should write non-fully-qualified type names
  // for placeholder types which were not originally fully-qualified.
  FieldDescriptorProto proto;

  // Bar is not a placeholder, so it is fully-qualified.
  bar_field_->CopyTo(&proto);
  EXPECT_EQ(".Bar", proto.type_name());
  EXPECT_EQ(FieldDescriptorProto::TYPE_MESSAGE, proto.type());

  // Baz is an unqualified placeholder.
  proto.Clear();
  baz_field_->CopyTo(&proto);
  EXPECT_EQ("Baz", proto.type_name());
  EXPECT_FALSE(proto.has_type());

  // Moo is a fully-qualified placeholder.
  proto.Clear();
  moo_field_->CopyTo(&proto);
  EXPECT_EQ(".corge.Moo", proto.type_name());
  EXPECT_EQ(FieldDescriptorProto::TYPE_ENUM, proto.type());
}